

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_add_handler(game_event_type type,game_event_handler *fn,void *user)

{
  event_handler_entry *peVar1;
  event_handler_entry *new;
  void *user_local;
  game_event_handler *fn_local;
  game_event_type type_local;
  
  if (fn != (game_event_handler *)0x0) {
    peVar1 = (event_handler_entry *)mem_alloc(0x18);
    peVar1->fn = fn;
    peVar1->user = user;
    peVar1->next = event_handlers[type];
    event_handlers[type] = peVar1;
    return;
  }
  __assert_fail("fn != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/game-event.c"
                ,0x34,"void event_add_handler(game_event_type, game_event_handler *, void *)");
}

Assistant:

void event_add_handler(game_event_type type, game_event_handler *fn, void *user)
{
	struct event_handler_entry *new;

	assert(fn != NULL);

	/* Make a new entry */
	new = mem_alloc(sizeof *new);
	new->fn = fn;
	new->user = user;

	/* Add it to the head of the appropriate list */
	new->next = event_handlers[type];
	event_handlers[type] = new;
}